

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 size)

{
  ImGuiWindow *this;
  ImVec2 grid_off;
  ImVec2 grid_off_00;
  float h;
  float s;
  float v;
  float fVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID IVar4;
  ImU32 IVar5;
  undefined7 extraout_var;
  ImVec4 *pIVar6;
  size_t data_size;
  uint flags_00;
  ImDrawList *pIVar7;
  char *type;
  ImDrawFlags flags_01;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  uint uVar10;
  bool hovered;
  bool held;
  ImVec4 col_rgb;
  ImRect bb;
  ImVec4 col_source;
  bool local_111;
  ImGuiID local_110;
  bool local_109;
  ImVec4 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  ImVec2 local_e8;
  ImVec2 IStack_e0;
  ImRect local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  ImVec4 local_a8;
  ImVec4 local_98;
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_c8._8_4_ = in_XMM0_Dc;
  local_c8._0_8_ = size;
  local_c8._12_4_ = in_XMM0_Dd;
  IVar4 = ImGuiWindow::GetID(this,desc_id,(char *)0x0);
  fVar8 = GetFrameHeight();
  fVar9 = 0.0;
  if (((float)local_c8._0_4_ == 0.0) && (!NAN((float)local_c8._0_4_))) {
    local_c8._0_4_ = fVar8;
  }
  local_f8 = (float)local_c8._4_4_;
  if (((float)local_c8._4_4_ == 0.0) && (!NAN((float)local_c8._4_4_))) {
    local_f8 = fVar8;
  }
  local_d8.Min.x = (this->DC).CursorPos.x;
  local_d8.Min.y = (this->DC).CursorPos.y;
  local_c8._4_4_ = local_f8;
  local_d8.Max.x = local_d8.Min.x + (float)local_c8._0_4_;
  local_d8.Max.y = local_d8.Min.y + local_f8;
  if (fVar8 <= local_f8) {
    fVar9 = (pIVar2->Style).FramePadding.y;
  }
  local_110 = IVar4;
  fStack_f4 = local_f8;
  fStack_f0 = local_f8;
  fStack_ec = local_f8;
  ItemSize(&local_d8,fVar9);
  IVar4 = local_110;
  local_b0 = 0;
  bVar3 = ItemAdd(&local_d8,local_110,(ImRect *)0x0,0);
  if (!bVar3) goto LAB_00166c18;
  bVar3 = ButtonBehavior(&local_d8,IVar4,&local_111,&local_109,0);
  flags_00 = flags & 0xfff9ffff;
  if ((flags & 2U) == 0) {
    flags_00 = flags;
  }
  local_b0 = CONCAT71(extraout_var,bVar3);
  h = col->x;
  s = col->y;
  v = col->z;
  fVar1 = col->w;
  local_108.x = h;
  local_108.y = s;
  local_108.z = v;
  local_108.w = fVar1;
  if ((flags_00 >> 0x1c & 1) != 0) {
    ColorConvertHSVtoRGB(h,s,v,&local_108.x,&local_108.y,&local_108.z);
  }
  local_98.x = local_108.x;
  local_98.y = local_108.y;
  local_98.z = local_108.z;
  fVar9 = (float)local_c8._0_4_;
  if (local_f8 <= (float)local_c8._0_4_) {
    fVar9 = local_f8;
  }
  fVar9 = fVar9 / 2.99;
  local_98.w = 1.0;
  local_f8 = (pIVar2->Style).FrameRounding;
  local_e8.y = local_d8.Min.y;
  local_e8.x = local_d8.Min.x;
  IStack_e0.y = local_d8.Max.y;
  IStack_e0.x = local_d8.Max.x;
  uVar10 = 0;
  if ((flags_00 >> 10 & 1) == 0) {
    local_e8.y = local_d8.Min.y + 0.75;
    local_e8.x = local_d8.Min.x + 0.75;
    IStack_e0.y = local_d8.Max.y + -0.75;
    IStack_e0.x = local_d8.Max.x + -0.75;
    uVar10 = 0xbf400000;
  }
  if (fVar9 * 0.5 <= local_f8) {
    local_f8 = fVar9 * 0.5;
  }
  if (((flags_00 >> 0x12 & 1) == 0) || (1.0 <= local_108.w)) {
    pIVar6 = &local_108;
    if ((flags_00 >> 0x11 & 1) == 0) {
      pIVar6 = &local_98;
    }
    local_a8.x = pIVar6->x;
    local_a8.y = pIVar6->y;
    local_a8.z = pIVar6->z;
    local_a8.w = pIVar6->w;
    pIVar7 = this->DrawList;
    if (1.0 <= local_a8.w) {
      IVar5 = GetColorU32(&local_a8);
      pIVar6 = (ImVec4 *)&IStack_e0;
      flags_01 = 0;
      goto LAB_00166ae9;
    }
    local_78 = local_e8;
    uStack_70 = 0;
    local_88._8_8_ = 0;
    local_88._0_4_ = IStack_e0.x;
    local_88._4_4_ = IStack_e0.y;
    local_c8._0_4_ = fVar9;
    local_68 = ZEXT416(uVar10);
    IVar5 = GetColorU32(&local_a8);
    grid_off.y = (float)local_68._0_4_;
    grid_off.x = (float)local_68._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (pIVar7,local_78,(ImVec2)local_88._0_8_,IVar5,(float)local_c8._0_4_,grid_off,local_f8,
               0);
  }
  else {
    local_68 = ZEXT416(uVar10);
    local_88 = ZEXT416((uint)(float)(int)((IStack_e0.x + local_e8.x) * 0.5 + 0.5));
    pIVar7 = this->DrawList;
    local_48 = IStack_e0;
    uStack_40 = 0;
    local_58.y = local_e8.y;
    local_58.x = local_e8.x + fVar9;
    uStack_50 = 0;
    local_c8._0_4_ = fVar9;
    local_78 = (ImVec2)desc_id;
    IVar5 = GetColorU32(&local_108);
    grid_off_00.y = (float)local_68._0_4_;
    grid_off_00.x = (float)local_68._0_4_ - (float)local_c8._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (pIVar7,local_58,local_48,IVar5,(float)local_c8._0_4_,grid_off_00,local_f8,0xa0);
    pIVar7 = this->DrawList;
    pIVar6 = &local_a8;
    local_a8.y = IStack_e0.y;
    local_a8.x = (float)local_88._0_4_;
    IVar5 = GetColorU32(&local_98);
    flags_01 = 0x50;
    desc_id = (char *)local_78;
LAB_00166ae9:
    ImDrawList::AddRectFilled(pIVar7,&local_e8,(ImVec2 *)pIVar6,IVar5,local_f8,flags_01);
  }
  RenderNavHighlight(&local_d8,local_110,1);
  if ((flags_00 >> 10 & 1) == 0) {
    if ((pIVar2->Style).FrameBorderSize <= 0.0) {
      pIVar7 = this->DrawList;
      IVar5 = GetColorU32(7,1.0);
      ImDrawList::AddRect(pIVar7,&local_d8.Min,&local_d8.Max,IVar5,local_f8,0,1.0);
    }
    else {
      p_min.y = local_d8.Min.y;
      p_min.x = local_d8.Min.x;
      p_max.y = local_d8.Max.y;
      p_max.x = local_d8.Max.x;
      RenderFrameBorder(p_min,p_max,local_f8);
    }
  }
  if ((((flags_00 >> 9 & 1) == 0) && (pIVar2->ActiveId == local_110)) &&
     (bVar3 = BeginDragDropSource(0), bVar3)) {
    if ((flags_00 & 2) == 0) {
      type = "_COL4F";
      data_size = 0x10;
    }
    else {
      type = "_COL3F";
      data_size = 0xc;
    }
    SetDragDropPayload(type,&local_108,data_size,2);
    ColorButton(desc_id,col,flags_00,(ImVec2)0x0);
    SameLine(0.0,-1.0);
    TextEx("Color",(char *)0x0,0);
    EndDragDropSource();
  }
  if (((flags_00 & 0x40) == 0) && (local_111 == true)) {
    ColorTooltip(desc_id,&col->x,flags_00 & 0x18060002);
  }
LAB_00166c18:
  return (bool)(char)local_b0;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}